

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O0

void __thiscall
IRT::CCallSimplifierVisitor::Visit(CCallSimplifierVisitor *this,CJumpStatement *statement)

{
  CJumpStatement *this_00;
  undefined1 local_30 [16];
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_20;
  CJumpStatement *local_18;
  CJumpStatement *statement_local;
  CCallSimplifierVisitor *this_local;
  
  local_18 = statement;
  statement_local = (CJumpStatement *)this;
  this_00 = (CJumpStatement *)operator_new(0x10);
  CJumpStatement::getLabel(local_18);
  CLabelStatement::CastCopy((CLabelStatement *)local_30);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)(local_30 + 8),
             (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)local_30);
  CJumpStatement::CJumpStatement
            (this_00,(unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                      *)(local_30 + 8));
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_20,(pointer)this_00);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
            (&this->childStatement,&local_20);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_20);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
               *)(local_30 + 8));
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
               *)local_30);
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CJumpStatement &statement) {
    childStatement = std::move(
            std::unique_ptr<const CStatement>(
                    new CJumpStatement(
                            std::move(statement.getLabel()->CastCopy())
                    )
            )
    );
}